

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundle-foreach.h
# Opt level: O2

void rtosc::
     bundle_foreach<void(*)(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)>
               (Port *p,char *name,char *old_end,char *name_buffer,size_t buffer_size,Ports *base,
               void *data,void *runtime,
               _func_void_Port_ptr_char_ptr_char_ptr_Ports_ptr_void_ptr_void_ptr **ftor,
               bool expand_bundles,bool cut_afterwards,bool ranges)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *__s;
  char *pcVar6;
  char *pcVar7;
  uint i;
  uint uVar8;
  uint uVar9;
  
  __s = old_end;
  for (pcVar6 = name + 1; pcVar6[-1] != '#'; pcVar6 = pcVar6 + 1) {
    *__s = pcVar6[-1];
    __s = __s + 1;
  }
  uVar2 = atoi(pcVar6);
  uVar8 = uVar2;
  if (ranges) {
    uVar8 = 1;
  }
  do {
    pcVar7 = pcVar6;
    pcVar6 = pcVar7 + 1;
  } while ((int)*pcVar7 - 0x30U < 10);
  uVar9 = 1;
  if (expand_bundles) {
    uVar9 = uVar8;
  }
  pcVar6 = __s;
  for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    if (ranges) {
      iVar3 = snprintf(__s,0x10,"[0,%d]",(ulong)(uVar2 - 1));
      pcVar5 = pcVar6 + iVar3;
    }
    else {
      pcVar5 = pcVar6;
      if (expand_bundles) {
        iVar3 = snprintf(__s,0x10,"%d",(ulong)uVar8);
        pcVar5 = __s + iVar3;
      }
    }
    for (lVar4 = 0; (cVar1 = pcVar7[lVar4], cVar1 != '\0' && (cVar1 != ':')); lVar4 = lVar4 + 1) {
      pcVar5[lVar4] = cVar1;
    }
    pcVar6 = pcVar5 + lVar4;
    pcVar5[lVar4] = '\0';
    (**ftor)(p,name_buffer,old_end,base,data,runtime);
  }
  if (cut_afterwards) {
    pcVar6 = old_end;
  }
  *pcVar6 = '\0';
  return;
}

Assistant:

void bundle_foreach(const struct Port& p, const char* name, char* const old_end,
                    const char* const name_buffer, size_t buffer_size,
                    /* data which is only being used by the ftors */
                    const struct Ports& base,
                    void* const data, void* const runtime, const F& ftor,
                    /* options */
                    const bool expand_bundles = true,
                    const bool cut_afterwards = true,
                    const bool ranges = false)
{
    ssize_t space_left = buffer_size - (ssize_t)(old_end - name_buffer);
#ifdef NDEBUG
    (void)space_left;
#endif
    assert(space_left > 0);
    assert(space_left <= (ssize_t)buffer_size);

    char *pos = old_end;
    while(*name != '#') { assert(space_left); *pos++ = *name++; --space_left; }
    const unsigned max = atoi(name+1);
    const unsigned iterations = (expand_bundles && !ranges) ? max : 1;
    while(isdigit(*++name)) ;

    char* pos2 = pos;

    const char* name_precheck = name;
    while(*name_precheck && *name_precheck != ':')
        name_precheck++;
    assert(space_left > 16 + (ssize_t)(name_precheck - name) + 1);

    for(unsigned i=0; i<iterations; ++i)
    {
        const char* name2_2 = name;
        if (ranges)
            pos2 += snprintf(pos,16,"[0,%d]",max-1);
        else if(expand_bundles)
            pos2 = pos + snprintf(pos,16,"%d",i);

        // append everything behind the '#' (for cases like a#N/b)
        while(*name2_2 && *name2_2 != ':')
            *pos2++ = *name2_2++;
        *pos2 = 0;

        ftor(&p, name_buffer, old_end, base, data, runtime);
    }

    *(cut_afterwards ? old_end : pos2) = 0;
}